

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter_p.h
# Opt level: O2

int QUtf8Functions::toUtf8<QUtf8BaseTraits,unsigned_char*,char16_t_const*>
              (char16_t u,uchar **dst,char16_t **src,char16_t *end)

{
  char16_t cVar1;
  char16_t *pcVar2;
  byte *pbVar3;
  uchar *puVar4;
  byte bVar5;
  uint uVar6;
  undefined6 in_register_0000003a;
  ulong uVar7;
  
  uVar7 = CONCAT62(in_register_0000003a,u);
  if (0x7f < (ushort)u) {
    uVar6 = (uint)uVar7;
    if ((ushort)u < 0x800) {
      bVar5 = (byte)(uVar6 >> 6) | 0xc0;
    }
    else {
      if ((uVar6 & 0xf800) == 0xd800) {
        pcVar2 = *src;
        if (pcVar2 == end) {
          return -2;
        }
        if ((uVar6 & 0xdc00) != 0xd800) {
          return -1;
        }
        cVar1 = *pcVar2;
        if (((ushort)cVar1 & 0xfc00) != 0xdc00) {
          return -1;
        }
        *src = pcVar2 + 1;
        uVar6 = uVar6 * 0x400 + (uint)(ushort)cVar1 + 0xfca02400;
        uVar7 = (ulong)uVar6;
        pbVar3 = *dst;
        *dst = pbVar3 + 1;
        *pbVar3 = (byte)(uVar6 >> 0x12) | 0xf0;
        bVar5 = (byte)(uVar6 >> 0xc) & 0x3f | 0x80;
      }
      else {
        bVar5 = (byte)((ushort)u >> 0xc) | 0xe0;
      }
      pbVar3 = *dst;
      *dst = pbVar3 + 1;
      *pbVar3 = bVar5;
      bVar5 = (byte)(uVar7 >> 6) & 0x3f | 0x80;
    }
    pbVar3 = *dst;
    *dst = pbVar3 + 1;
    *pbVar3 = bVar5;
    uVar7 = (ulong)((byte)uVar7 & 0x3f | 0x80);
  }
  puVar4 = *dst;
  *dst = puVar4 + 1;
  *puVar4 = (uchar)uVar7;
  return 0;
}

Assistant:

inline
    int toUtf8(char16_t u, OutputPtr &dst, InputPtr &src, InputPtr end)
    {
        if (!Traits::skipAsciiHandling && u < 0x80) {
            // U+0000 to U+007F (US-ASCII) - one byte
            Traits::appendByte(dst, uchar(u));
            return 0;
        } else if (u < 0x0800) {
            // U+0080 to U+07FF - two bytes
            // first of two bytes
            Traits::appendByte(dst, 0xc0 | uchar(u >> 6));
        } else {
            if (!QChar::isSurrogate(u)) {
                // U+0800 to U+FFFF (except U+D800-U+DFFF) - three bytes
                if (!Traits::allowNonCharacters && QChar::isNonCharacter(u))
                    return Traits::Error;

                // first of three bytes
                Traits::appendByte(dst, 0xe0 | uchar(u >> 12));
            } else {
                // U+10000 to U+10FFFF - four bytes
                // need to get one extra codepoint
                if (Traits::availableUtf16(src, end) == 0)
                    return Traits::EndOfString;

                char16_t low = Traits::peekUtf16(src);
                if (!QChar::isHighSurrogate(u))
                    return Traits::Error;
                if (!QChar::isLowSurrogate(low))
                    return Traits::Error;

                Traits::advanceUtf16(src);
                char32_t ucs4 = QChar::surrogateToUcs4(u, low);

                if (!Traits::allowNonCharacters && QChar::isNonCharacter(ucs4))
                    return Traits::Error;

                // first byte
                Traits::appendByte(dst, 0xf0 | (uchar(ucs4 >> 18) & 0xf));

                // second of four bytes
                Traits::appendByte(dst, 0x80 | (uchar(ucs4 >> 12) & 0x3f));

                // for the rest of the bytes
                u = char16_t(ucs4);
            }

            // second to last byte
            Traits::appendByte(dst, 0x80 | (uchar(u >> 6) & 0x3f));
        }

        // last byte
        Traits::appendByte(dst, 0x80 | (u & 0x3f));
        return 0;
    }